

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::writeOp<(moira::Core)1,(moira::Mode)4,2,0ull>(Moira *this,int n,u32 ea,u32 val)

{
  u32 val_local;
  u32 ea_local;
  int n_local;
  Moira *this_local;
  
  this->writeBuffer = (u16)val;
  writeM<(moira::Core)1,(moira::Mode)4,2,0ull>(this,ea,val);
  return;
}

Assistant:

void
Moira::writeOp(int n, u32 ea, u32 val)
{
    switch (M) {

        case Mode::DN: writeD<S>(n, val); break;
        case Mode::AN: writeA<S>(n, val); break;
        case Mode::IM: fatalError;

        default:

            writeBuffer = (S == Long) ? u16(val >> 16) : u16(val & 0xFFFF);

            // Write to effective address
            writeM<C, M, S, F>(ea, val);
    }
}